

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O2

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  int iVar1;
  long __off;
  stbi__context s;
  stbi__context sStack_108;
  
  __off = ftell((FILE *)f);
  stbi__start_file(&sStack_108,f);
  iVar1 = stbi__info_main(&sStack_108,x,y,comp);
  fseek((FILE *)f,__off,0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}